

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classset.h
# Opt level: O3

ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
* __thiscall
soplex::
ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
::operator=(ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
            *this,ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                  *rhs)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Item *pIVar3;
  Item *pIVar4;
  undefined8 uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar10;
  uint uVar9;
  
  if (this != rhs) {
    uVar6 = this->themax;
    if ((int)uVar6 < rhs->thesize) {
      reMax(this,rhs->thesize);
      uVar6 = this->themax;
    }
    this->thesize = 0;
    this->thenum = 0;
    this->firstfree = ~uVar6;
    iVar7 = rhs->thesize;
    if (0 < (long)iVar7) {
      pIVar3 = rhs->theitem;
      pIVar4 = this->theitem;
      lVar10 = 0;
      do {
        if (pIVar4 != pIVar3) {
          *(undefined8 *)
           ((long)&(pIVar4->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem + lVar10) =
               *(undefined8 *)
                ((long)&(pIVar3->data).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .m_elem + lVar10);
          *(undefined8 *)
           ((long)&(pIVar4->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memsize + lVar10) =
               *(undefined8 *)
                ((long)&(pIVar3->data).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memsize + lVar10);
          puVar1 = (undefined8 *)((long)&(pIVar3->data).thenext + lVar10);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)&(pIVar4->data).thenext + lVar10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
        }
        *(undefined4 *)((long)&pIVar4->info + lVar10) =
             *(undefined4 *)((long)&pIVar3->info + lVar10);
        lVar10 = lVar10 + 0x28;
      } while ((long)iVar7 * 0x28 != lVar10);
    }
    iVar7 = rhs->thenum;
    if (0 < iVar7) {
      lVar10 = 0;
      do {
        this->thekey[lVar10] = rhs->thekey[lVar10];
        lVar10 = lVar10 + 1;
        iVar7 = rhs->thenum;
      } while (lVar10 < iVar7);
    }
    uVar6 = rhs->themax;
    if ((uVar6 ^ rhs->firstfree) == 0xffffffff) {
      this->firstfree = ~this->themax;
    }
    else {
      this->firstfree = rhs->firstfree;
      uVar9 = rhs->firstfree;
      do {
        uVar8 = ~uVar9;
        uVar9 = rhs->theitem[(int)uVar8].info;
      } while ((uVar9 ^ uVar6) != 0xffffffff);
      this->theitem[(int)uVar8].info = ~this->themax;
    }
    this->thenum = iVar7;
    this->thesize = rhs->thesize;
  }
  return this;
}

Assistant:

ClassSet < T >& operator=(const ClassSet < T >& rhs)
   {
      if(this != &rhs)
      {
         int i;

         if(rhs.size() > max())
            reMax(rhs.size());

         clear();

         for(i = 0; i < rhs.size(); ++i)
            theitem[i] = std::move(rhs.theitem[i]);

         for(i = 0; i < rhs.num(); ++i)
            thekey[i] = rhs.thekey[i];

         if(rhs.firstfree == -rhs.themax - 1)
            firstfree = -themax - 1;
         else
         {
            firstfree = rhs.firstfree;
            i = rhs.firstfree;

            while(rhs.theitem[ -i - 1].info != -rhs.themax - 1)
               i = rhs.theitem[ -i - 1].info;

            theitem[ -i - 1].info = -themax - 1;
         }

         thenum = rhs.thenum;
         thesize = rhs.thesize;

         assert(isConsistent());
      }

      return *this;
   }